

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

Array __thiscall pbrt::ScratchBuffer::Alloc<pbrt::Vertex[]>(ScratchBuffer *this,size_t n)

{
  Point3fi *pPVar1;
  Array pVVar2;
  Float *pFVar3;
  
  pVVar2 = (Array)Alloc(this,n * 0x160,8);
  if (n != 0) {
    pFVar3 = &pVVar2->pdfFwd;
    do {
      (((SampledSpectrum *)(pFVar3 + -0x54))->values).values[0] = 0.0;
      (((SampledSpectrum *)(pFVar3 + -0x54))->values).values[1] = 0.0;
      (pFVar3 + -0x52)[0] = 0.0;
      (pFVar3 + -0x52)[1] = 0.0;
      pPVar1 = &(((anon_union_248_3_83785cfc_for_Vertex_2 *)(pFVar3 + -0x4f))->ei).super_Interaction
                .pi;
      (pPVar1->super_Point3<pbrt::Interval<float>_>).
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = 0.0;
      (pPVar1->super_Point3<pbrt::Interval<float>_>).
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = 0.0;
      *(undefined8 *)(pFVar3 + -0x4d) = 0;
      *(undefined8 *)(pFVar3 + -0x4b) = 0;
      *(undefined8 *)(pFVar3 + -0x49) = 0;
      *(undefined8 *)(pFVar3 + -0x47) = 0;
      *(undefined8 *)(pFVar3 + -0x45) = 0;
      *(undefined8 *)(pFVar3 + -0x43) = 0;
      *(undefined8 *)(pFVar3 + -0x41) = 0;
      *(undefined8 *)(pFVar3 + -0x49) = 0;
      *(undefined8 *)(pFVar3 + -0x47) = 0;
      *(undefined8 *)(pFVar3 + -0x45) = 0;
      *(undefined8 *)(pFVar3 + -0x43) = 0;
      *(undefined8 *)(pFVar3 + -0x41) = 0;
      *(undefined8 *)(pFVar3 + -0x3f) = 0;
      *(undefined8 *)(pFVar3 + -0x3d) = 0;
      *(undefined8 *)(pFVar3 + -0x3b) = 0;
      (((BxDFHandle *)(pFVar3 + -0xf))->
      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
      ).bits = 0;
      (((Frame *)(pFVar3 + -0xd))->x).super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
      (((Frame *)(pFVar3 + -0xd))->x).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
      *(undefined8 *)(pFVar3 + -0xb) = 0;
      *(undefined8 *)(pFVar3 + -9) = 0x3f800000;
      (((Vector3f *)(pFVar3 + -7))->super_Tuple3<pbrt::Vector3,_float>).x = 0.0;
      (((Vector3f *)(pFVar3 + -7))->super_Tuple3<pbrt::Vector3,_float>).y = 0.0;
      pFVar3[-5] = 1.0;
      *(undefined8 *)pFVar3 = 0;
      (((Normal3f *)(pFVar3 + -4))->super_Tuple3<pbrt::Normal3,_float>).x = 0.0;
      (((Normal3f *)(pFVar3 + -4))->super_Tuple3<pbrt::Normal3,_float>).y = 0.0;
      *(undefined8 *)((long)pFVar3 + -0xb) = 0;
      pFVar3 = pFVar3 + 0x58;
      n = n - 1;
    } while (n != 0);
  }
  return pVVar2;
}

Assistant:

PBRT_CPU_GPU typename AllocationTraits<T>::Array Alloc(size_t n = 1) {
        using ElementType = typename std::remove_extent<T>::type;
        ElementType *ret =
            (ElementType *)Alloc(n * sizeof(ElementType), alignof(ElementType));
        for (size_t i = 0; i < n; ++i)
            new (&ret[i]) ElementType();
        return ret;
    }